

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult_p.h
# Opt level: O3

void __thiscall QSqlResultPrivate::~QSqlResultPrivate(QSqlResultPrivate *this)

{
  int *piVar1;
  void *pvVar2;
  
  *(undefined **)this = &QSqlDriverPlugin::typeinfo;
  QArrayDataPointer<QHolder>::~QArrayDataPointer((QArrayDataPointer<QHolder> *)(this + 0x80));
  QHash<QString,_QList<int>_>::~QHash((QHash<QString,_QList<int>_> *)(this + 0x78));
  QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)(this + 0x60));
  QHash<int,_QFlags<QSql::ParamTypeFlag>_>::~QHash
            ((QHash<int,_QFlags<QSql::ParamTypeFlag>_> *)(this + 0x58));
  piVar1 = *(int **)(this + 0x40);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x40),2,0x10);
    }
  }
  QSqlError::~QSqlError((QSqlError *)(this + 0x38));
  piVar1 = *(int **)(this + 0x20);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate(*(QArrayData **)(this + 0x20),2,0x10);
    }
  }
  piVar1 = *(int **)(this + 0x10);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      pvVar2 = *(void **)(this + 0x10);
      if (pvVar2 == (void *)0x0) {
        pvVar2 = (void *)0x0;
      }
      operator_delete(pvVar2);
      return;
    }
  }
  return;
}

Assistant:

virtual ~QSqlResultPrivate() = default;